

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateSerializeWithCachedSizes
          (StringFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this->descriptor_,(this->super_FieldGenerator).options_,false,&this->variables_,
               "this->$name$().data(), this->$name$().length(),\n",printer);
  }
  io::Printer::Print(printer,&this->variables_,
                     "::google::protobuf::internal::WireFormatLite::Write$declared_type$MaybeAliased(\n  $number$, this->$name$(), output);\n"
                    );
  return;
}

Assistant:

void StringFieldGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) const {
  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, false, variables_,
        "this->$name$().data(), this->$name$().length(),\n", printer);
  }
  printer->Print(variables_,
    "::google::protobuf::internal::WireFormatLite::Write$declared_type$MaybeAliased(\n"
    "  $number$, this->$name$(), output);\n");
}